

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

uniformMatrixNfv
gl4cts::GLSL420Pack::Utils::getUniformMatrixNfv(Functions *gl,GLuint n_columns,GLuint n_rows)

{
  TestError *this;
  undefined *puVar1;
  ulong uVar2;
  
  if (n_columns == 4) {
    if (2 < n_rows - 2) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid number of rows",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                 ,0x3a9);
      goto LAB_00a65fc2;
    }
    puVar1 = &DAT_016d2018;
  }
  else {
    if (n_columns != 3) {
      if (n_columns != 2) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Invalid number of columns",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                   ,0x3ad);
LAB_00a65fc2:
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (2 < n_rows - 2) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Invalid number of rows",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                   ,0x389);
        goto LAB_00a65fc2;
      }
      uVar2 = (ulong)((n_rows - 2) * 0x10 + 0x15e0);
      goto LAB_00a65f0c;
    }
    if (2 < n_rows - 2) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid number of rows",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                 ,0x399);
      goto LAB_00a65fc2;
    }
    puVar1 = &DAT_016d2000;
  }
  uVar2 = *(ulong *)(puVar1 + (ulong)(n_rows - 2) * 8);
LAB_00a65f0c:
  return *(uniformMatrixNfv *)((long)&gl->activeShaderProgram + uVar2);
}

Assistant:

Utils::uniformMatrixNfv Utils::getUniformMatrixNfv(const glw::Functions& gl, glw::GLuint n_columns, glw::GLuint n_rows)
{
	uniformMatrixNfv result = 0;

	switch (n_columns)
	{
	case 2:
		switch (n_rows)
		{
		case 2:
			result = gl.uniformMatrix2fv;
			break;
		case 3:
			result = gl.uniformMatrix2x3fv;
			break;
		case 4:
			result = gl.uniformMatrix2x4fv;
			break;
		default:
			TCU_FAIL("Invalid number of rows");
		}
		break;
	case 3:
		switch (n_rows)
		{
		case 2:
			result = gl.uniformMatrix3x2fv;
			break;
		case 3:
			result = gl.uniformMatrix3fv;
			break;
		case 4:
			result = gl.uniformMatrix3x4fv;
			break;
		default:
			TCU_FAIL("Invalid number of rows");
		}
		break;
	case 4:
		switch (n_rows)
		{
		case 2:
			result = gl.uniformMatrix4x2fv;
			break;
		case 3:
			result = gl.uniformMatrix4x3fv;
			break;
		case 4:
			result = gl.uniformMatrix4fv;
			break;
		default:
			TCU_FAIL("Invalid number of rows");
		}
		break;
	default:
		TCU_FAIL("Invalid number of columns");
	}

	return result;
}